

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O2

void Io_ReadPlaMarkContained(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  word *pIn1;
  word *pIn2;
  int iVar1;
  int iVar2;
  ulong uVar3;
  int Entry;
  int Entry_00;
  long lVar4;
  ulong uVar5;
  long local_48;
  
  Vec_BitFill(vMarks,nCubes,nWords);
  uVar5 = 0;
  uVar3 = 0;
  if (0 < nCubes) {
    uVar3 = (ulong)(uint)nCubes;
  }
  local_48 = 1;
  do {
    if (uVar5 == uVar3) {
      return;
    }
    iVar1 = Vec_BitEntry(vMarks,(int)uVar5);
    lVar4 = local_48;
    if (iVar1 == 0) {
      for (; iVar1 = (int)lVar4, iVar1 < nCubes; lVar4 = lVar4 + 1) {
        iVar2 = Vec_BitEntry(vMarks,iVar1);
        if (iVar2 == 0) {
          pIn1 = pCs[uVar5];
          pIn2 = pCs[lVar4];
          iVar2 = Abc_TtImply(pIn1,pIn2,nWords);
          if (iVar2 == 0) {
            iVar1 = Abc_TtImply(pIn2,pIn1,nWords);
            if (iVar1 != 0) {
              Vec_BitWriteEntry(vMarks,(int)uVar5,Entry_00);
              break;
            }
          }
          else {
            Vec_BitWriteEntry(vMarks,iVar1,Entry);
          }
        }
      }
    }
    uVar5 = uVar5 + 1;
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

void Io_ReadPlaMarkContained( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c2;
    Vec_BitFill( vMarks, nCubes, 0 );
    for ( c1 = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
            for ( c2 = c1 + 1; c2 < nCubes; c2++ )
                if ( !Vec_BitEntry(vMarks, c2) )
                {
                    if ( Abc_TtImply(pCs[c1], pCs[c2], nWords) )
                        Vec_BitWriteEntry( vMarks, c2, 1 );
                    else if ( Abc_TtImply(pCs[c2], pCs[c1], nWords) )
                    {
                        Vec_BitWriteEntry( vMarks, c1, 1 );
                        break;
                    }
                }
}